

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethernet.cpp
# Opt level: O0

FUNCTION_RETURN
license::hw_identifier::generate_ethernet_pc_id
          (vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
           *data,bool use_ip)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference paVar4;
  reference pvVar5;
  uchar local_94;
  uchar local_93;
  array<unsigned_char,_7UL> local_7f;
  bool all_zero;
  array<unsigned_char,_7UL> identifier;
  uint data_len;
  uint k;
  anon_struct_1044_5_0902c47b *it;
  iterator __end2;
  iterator __begin2;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *__range2;
  undefined1 local_38 [4];
  FUNCTION_RETURN result_adapterInfos;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapters;
  bool use_ip_local;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  *data_local;
  
  adapters.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = use_ip;
  std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::vector
            ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
             local_38);
  data_local._4_4_ =
       os::getAdapterInfos((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                            *)local_38);
  if (data_local._4_4_ == FUNC_RET_OK) {
    sVar3 = std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
            size((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
                 local_38);
    if (sVar3 == 0) {
      data_local._4_4_ = FUNC_RET_NOT_AVAIL;
    }
    else {
      __end2 = std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
               ::begin((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                        *)local_38);
      it = (anon_struct_1044_5_0902c47b *)
           std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::end
                     ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                       *)local_38);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<license::os::OsAdapterInfo_*,_std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>_>
                                         *)&it), bVar2) {
        paVar4 = __gnu_cxx::
                 __normal_iterator<license::os::OsAdapterInfo_*,_std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>_>
                 ::operator*(&__end2);
        memset(&local_7f,0,7);
        _all_zero = 6;
        if ((adapters.
             super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          _all_zero = 4;
        }
        bVar2 = true;
        identifier._M_elems[3] = '\0';
        identifier._M_elems[4] = '\0';
        identifier._M_elems[5] = '\0';
        identifier._M_elems[6] = '\0';
        while( true ) {
          bVar1 = false;
          if ((uint)identifier._M_elems._3_4_ < _all_zero) {
            bVar1 = bVar2;
          }
          if (!bVar1) break;
          bVar1 = false;
          if (bVar2) {
            if ((adapters.
                 super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              local_93 = paVar4->mac_address[(uint)identifier._M_elems._3_4_];
            }
            else {
              local_93 = paVar4->ipv4_address[(uint)identifier._M_elems._3_4_];
            }
            bVar1 = local_93 == '\0';
          }
          bVar2 = bVar1;
          identifier._M_elems._3_4_ = identifier._M_elems._3_4_ + 1;
        }
        if (!bVar2) {
          identifier._M_elems[3] = '\x01';
          identifier._M_elems[4] = '\0';
          identifier._M_elems[5] = '\0';
          identifier._M_elems[6] = '\0';
          for (; (uint)identifier._M_elems._3_4_ < 7;
              identifier._M_elems._3_4_ = identifier._M_elems._3_4_ + 1) {
            if (identifier._M_elems._3_4_ - 1 < _all_zero) {
              if ((adapters.
                   super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                local_94 = paVar4->mac_address[identifier._M_elems._3_4_ - 1];
              }
              else {
                local_94 = paVar4->ipv4_address[identifier._M_elems._3_4_ - 1];
              }
              pvVar5 = std::array<unsigned_char,_7UL>::operator[]
                                 (&local_7f,(ulong)(uint)identifier._M_elems._3_4_);
              *pvVar5 = local_94;
            }
            else {
              pvVar5 = std::array<unsigned_char,_7UL>::operator[]
                                 (&local_7f,(ulong)(uint)identifier._M_elems._3_4_);
              *pvVar5 = '*';
            }
          }
          pvVar5 = std::array<unsigned_char,_7UL>::operator[](&local_7f,0);
          *pvVar5 = '\0';
          std::
          vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
          push_back(data,&local_7f);
        }
        __gnu_cxx::
        __normal_iterator<license::os::OsAdapterInfo_*,_std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>_>
        ::operator++(&__end2);
      }
    }
  }
  std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::~vector
            ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
             local_38);
  return data_local._4_4_;
}

Assistant:

static FUNCTION_RETURN generate_ethernet_pc_id(vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> &data,
											   const bool use_ip) {
	vector<os::OsAdapterInfo> adapters;

	FUNCTION_RETURN result_adapterInfos = getAdapterInfos(adapters);
	if (result_adapterInfos != FUNC_RET_OK) {
		return result_adapterInfos;
	}
	if (adapters.size() == 0) {
		return FUNC_RET_NOT_AVAIL;
	}

	for (auto &it : adapters) {
		unsigned int k, data_len;
		array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> identifier = {};
		data_len = use_ip ? sizeof(os::OsAdapterInfo::ipv4_address) : sizeof(os::OsAdapterInfo::mac_address);
		bool all_zero = true;
		for (k = 0; k < data_len && all_zero;k++) {
			all_zero = all_zero && ((use_ip ? it.ipv4_address[k] : it.mac_address[k]) == 0);
		}
		if (all_zero) {
			continue;
		}
		for (k = 1; k < HW_IDENTIFIER_PROPRIETARY_DATA; k++) {
			if ((k - 1) < data_len) {
				identifier[k] =
						use_ip ? it.ipv4_address[k - 1] : it.mac_address[k - 1];
			} else {
				identifier[k] = 42;
			}
		}
		//identifier[0] = identifier[0] & 0x1F;
		identifier[0] = 0;
		data.push_back(identifier);
	}

	return result_adapterInfos;
}